

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_ClearParticles(void)

{
  int local_c;
  int i;
  
  memset(Particles,0,(ulong)NumParticles << 7);
  ActiveParticles = 0xffff;
  InactiveParticles = 0;
  for (local_c = 0; local_c < (int)(NumParticles - 1); local_c = local_c + 1) {
    Particles[local_c].tnext = (short)local_c + 1;
  }
  Particles[local_c].tnext = 0xffff;
  return;
}

Assistant:

void P_ClearParticles ()
{
	int i;

	memset (Particles, 0, NumParticles * sizeof(particle_t));
	ActiveParticles = NO_PARTICLE;
	InactiveParticles = 0;
	for (i = 0; i < NumParticles-1; i++)
		Particles[i].tnext = i + 1;
	Particles[i].tnext = NO_PARTICLE;
}